

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

bcf_sr_regions_t * bcf_sr_regions_init(char *regions,int is_file,int ichr,int ifrom,int ito)

{
  htsExactFormat hVar1;
  kh_str2int_t *h;
  bool bVar2;
  khint_t kVar3;
  int iVar4;
  bcf_sr_regions_t *pbVar5;
  htsFile *phVar6;
  tbx_t *tbx;
  char **ppcVar7;
  void *pvVar8;
  char *pcVar9;
  size_t sVar10;
  undefined4 in_register_00000084;
  kh_str2int_t *hash;
  ulong uVar11;
  long lVar12;
  int *n;
  int from;
  undefined4 local_70;
  int to;
  ulong local_68;
  char *chr;
  uint local_54;
  char *chr_end;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  local_68 = CONCAT44(in_register_00000084,ito);
  if (is_file == 0) {
    pbVar5 = _regions_init_string(regions);
    return pbVar5;
  }
  pbVar5 = (bcf_sr_regions_t *)calloc(1,0xb0);
  pbVar5->start = -1;
  pbVar5->end = -1;
  pbVar5->prev_seq = -1;
  pbVar5->prev_start = -1;
  phVar6 = hts_open(regions,"rb");
  pbVar5->file = phVar6;
  if (phVar6 == (htsFile *)0x0) {
    fprintf(_stderr,"[%s:%d %s] Could not open file: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
            ,0x3dd,"bcf_sr_regions_init",regions);
  }
  else {
    tbx = tbx_index_load(regions);
    pbVar5->tbx = tbx;
    if (tbx != (tbx_t *)0x0) {
      n = &pbVar5->nseqs;
      ppcVar7 = tbx_seqnames(tbx,n);
      pbVar5->seq_names = ppcVar7;
      if (pbVar5->seq_hash == (void *)0x0) {
        pvVar8 = calloc(1,0x28);
        pbVar5->seq_hash = pvVar8;
      }
      if (0 < *n) {
        lVar12 = 0;
        do {
          h = (kh_str2int_t *)pbVar5->seq_hash;
          if (h != (kh_str2int_t *)0x0) {
            kVar3 = kh_put_str2int(h,pbVar5->seq_names[lVar12],(int *)&chr);
            h->vals[kVar3] = (int)lVar12;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < *n);
      }
      pcVar9 = strdup(regions);
      pbVar5->fname = pcVar9;
      pbVar5->is_bin = 1;
      return pbVar5;
    }
    sVar10 = strlen(regions);
    iVar4 = strcasecmp(".bed",regions + (long)(int)sVar10 + -4);
    local_38 = regions;
    if (iVar4 == 0) {
      local_70 = 0;
    }
    else {
      iVar4 = strcasecmp(".bed.gz",regions + (long)(int)sVar10 + -7);
      local_70 = CONCAT31((int3)((uint)iVar4 >> 8),iVar4 != 0);
    }
    hVar1 = (pbVar5->file->format).format;
    iVar4 = hts_getline(pbVar5->file,2,&pbVar5->line);
    if (0 < iVar4) {
      local_68 = local_68 & 0xffffffff;
      if (hVar1 == vcf) {
        local_68 = 1;
      }
      iVar4 = (int)local_68;
      uVar11 = (ulong)(uint)-iVar4;
      if (0 < iVar4) {
        uVar11 = local_68;
      }
      local_54 = ichr + 1;
      local_40 = (ulong)(ifrom + 1);
      local_48 = (ulong)(iVar4 + 1);
      do {
        iVar4 = _regions_parse_line((pbVar5->line).s,ichr,ifrom,(int)uVar11,&chr,&chr_end,&from,&to)
        ;
        if (iVar4 < 0) {
          iVar4 = -1;
          if ((int)local_68 < 0) {
            iVar4 = _regions_parse_line((pbVar5->line).s,ichr,ifrom,ifrom,&chr,&chr_end,&from,&to);
          }
          if (-1 < iVar4) goto LAB_00113c23;
          fprintf(_stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
                  ,0x3f7,local_38,(ulong)local_54,local_40,local_48);
          hts_close(pbVar5->file);
          pbVar5->file = (htsFile *)0x0;
          free(pbVar5);
          bVar2 = true;
        }
        else {
LAB_00113c23:
          pcVar9 = chr_end;
          if (iVar4 == 0) {
            bVar2 = false;
          }
          else {
            if ((char)local_70 == '\0') {
              from = from + 1;
            }
            *chr_end = '\0';
            _regions_add(pbVar5,chr,from,to);
            *pcVar9 = '\t';
            bVar2 = false;
          }
        }
        if (bVar2) {
          return (bcf_sr_regions_t *)0x0;
        }
        iVar4 = hts_getline(pbVar5->file,2,&pbVar5->line);
      } while (0 < iVar4);
    }
    hts_close(pbVar5->file);
    pbVar5->file = (htsFile *)0x0;
    if (pbVar5->nseqs != 0) {
      return pbVar5;
    }
  }
  free(pbVar5);
  return (bcf_sr_regions_t *)0x0;
}

Assistant:

bcf_sr_regions_t *bcf_sr_regions_init(const char *regions, int is_file, int ichr, int ifrom, int ito)
{
    bcf_sr_regions_t *reg;
    if ( !is_file ) return _regions_init_string(regions);

    reg = (bcf_sr_regions_t *) calloc(1, sizeof(bcf_sr_regions_t));
    reg->start = reg->end = -1;
    reg->prev_start = reg->prev_seq = -1;

    reg->file = hts_open(regions, "rb");
    if ( !reg->file )
    {
        fprintf(stderr,"[%s:%d %s] Could not open file: %s\n", __FILE__,__LINE__,__FUNCTION__,regions);
        free(reg);
        return NULL;
    }

    reg->tbx = tbx_index_load(regions);
    if ( !reg->tbx )
    {
        int len = strlen(regions);
        int is_bed  = strcasecmp(".bed",regions+len-4) ? 0 : 1;
        if ( !is_bed && !strcasecmp(".bed.gz",regions+len-7) ) is_bed = 1;

        if ( reg->file->format.format==vcf ) ito = 1;

        // read the whole file, tabix index is not present
        while ( hts_getline(reg->file, KS_SEP_LINE, &reg->line) > 0 )
        {
            char *chr, *chr_end;
            int from, to, ret;
            ret = _regions_parse_line(reg->line.s, ichr,ifrom,abs(ito), &chr,&chr_end,&from,&to);
            if ( ret < 0 )
            {
                if ( ito<0 )
                    ret = _regions_parse_line(reg->line.s, ichr,ifrom,ifrom, &chr,&chr_end,&from,&to);
                if ( ret<0 )
                {
                    fprintf(stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n", __FILE__,__LINE__,regions,ichr+1,ifrom+1,ito+1);
                    hts_close(reg->file); reg->file = NULL; free(reg);
                    return NULL;
                }
            }
            if ( !ret ) continue;
            if ( is_bed ) from++;
            *chr_end = 0;
            _regions_add(reg, chr, from, to);
            *chr_end = '\t';
        }
        hts_close(reg->file); reg->file = NULL;
        if ( !reg->nseqs ) { free(reg); return NULL; }
        return reg;
    }

    reg->seq_names = (char**) tbx_seqnames(reg->tbx, &reg->nseqs);
    if ( !reg->seq_hash )
        reg->seq_hash = khash_str2int_init();
    int i;
    for (i=0; i<reg->nseqs; i++)
    {
        khash_str2int_set(reg->seq_hash,reg->seq_names[i],i);
    }
    reg->fname  = strdup(regions);
    reg->is_bin = 1;
    return reg;
}